

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_generator.cc
# Opt level: O0

string * grpc_java_generator::anon_unknown_0::MixedLower
                   (string *__return_storage_ptr__,string *word)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  undefined1 local_51;
  undefined8 local_38;
  size_t i;
  bool after_underscore;
  string *word_local;
  string *w;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)word);
  iVar2 = tolower((int)*pcVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar2);
  bVar1 = false;
  for (local_38 = 1; uVar4 = std::__cxx11::string::length(), local_38 < uVar4;
      local_38 = local_38 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)word);
    if (*pcVar3 == '_') {
      bVar1 = true;
    }
    else {
      if (bVar1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)word);
        iVar2 = toupper((int)*pcVar3);
        local_51 = (char)iVar2;
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)word);
        local_51 = *pcVar3;
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_51);
      bVar1 = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string MixedLower(const string &word) {
  string w;
  w += static_cast<string::value_type>(tolower(word[0]));
  bool after_underscore = false;
  for (size_t i = 1; i < word.length(); ++i) {
    if (word[i] == '_') {
      after_underscore = true;
    } else {
      w += after_underscore ? static_cast<string::value_type>(toupper(word[i]))
                            : word[i];
      after_underscore = false;
    }
  }
  return w;
}